

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

MinVarInfo * __thiscall
adios2::format::BP5Deserializer::MinBlocksInfo
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,size_t WriterRank,size_t BlockID)

{
  MinMaxStruct *this_00;
  int iVar1;
  BP5VarRec *VarRec;
  size_t *psVar2;
  iterator __position;
  undefined4 uVar3;
  __node_base_ptr p_Var4;
  MinVarInfo *pMVar5;
  void *pvVar6;
  __node_base_ptr p_Var7;
  long lVar8;
  long lVar9;
  size_t Step;
  unsigned_long Step_00;
  size_t Step_01;
  MinBlockInfo *pMVar10;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *this_01;
  iterator iVar11;
  ulong uVar12;
  size_type __n;
  byte bVar13;
  MinBlockInfo Blk;
  MinBlockInfo local_88;
  
  bVar13 = 0;
  p_Var4 = (this->VarByKey)._M_h._M_buckets[(ulong)Var % (this->VarByKey)._M_h._M_bucket_count];
  for (p_Var7 = p_Var4->_M_nxt; (VariableBase *)p_Var7[1]._M_nxt != Var; p_Var7 = p_Var7->_M_nxt) {
    p_Var4 = p_Var7;
  }
  VarRec = (BP5VarRec *)p_Var4->_M_nxt[2]._M_nxt;
  pMVar5 = (MinVarInfo *)operator_new(0x38);
  psVar2 = VarRec->GlobalDims;
  pMVar5->Dims = (int)VarRec->DimCount;
  pMVar5->Shape = psVar2;
  pMVar5->IsValue = false;
  pMVar5->IsReverseDims = false;
  this_01 = &pMVar5->BlocksInfo;
  std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
            (this_01,(initializer_list<adios2::MinBlockInfo>)ZEXT816(0),(allocator_type *)&local_88)
  ;
  Step_00 = RelStep;
  if (this->m_RandomAccessMode == true) {
    Step_00 = (VarRec->AbsStepFromRel).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[RelStep];
  }
  if (this->m_FlattenSteps == true) {
    uVar12 = ((long)(this->m_ControlArray).
                    super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_ControlArray).
                    super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    Step_00 = 0;
  }
  else {
    uVar12 = Step_00 + 1;
  }
  pMVar5->Step = RelStep;
  iVar1 = (int)VarRec->DimCount;
  pMVar5->Dims = iVar1;
  pMVar5->Shape = (size_t *)0x0;
  pMVar5->IsReverseDims = this->m_WriterIsRowMajor != this->m_ReaderIsRowMajor && 1 < iVar1;
  pMVar5->WasLocalValue = VarRec->OrigShapeID == LocalValue;
  __n = 0;
  Step_01 = Step_00;
  if (Step_00 < uVar12) {
    do {
      pvVar6 = GetMetadataBase(this,VarRec,Step_01,WriterRank);
      if (pvVar6 != (void *)0x0) {
        if (pMVar5->Shape == (size_t *)0x0) {
          pMVar5->Shape = *(size_t **)((long)pvVar6 + 0x18);
        }
        __n = __n + 1;
      }
      Step_01 = Step_01 + 1;
    } while (uVar12 != Step_01);
  }
  std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::reserve(this_01,__n);
  if (Step_00 < uVar12) {
    do {
      pvVar6 = GetMetadataBase(this,VarRec,Step_00,WriterRank);
      if (pvVar6 != (void *)0x0) {
        if (VarRec->MinMaxOffset == 0xffffffffffffffff) {
          lVar9 = 0;
        }
        else {
          lVar9 = *(long *)((long)pvVar6 + VarRec->MinMaxOffset);
        }
        this_00 = &local_88.MinMax;
        lVar8 = (long)pMVar5->Dims * BlockID;
        local_88.Start = (size_t *)(*(long *)((long)pvVar6 + 0x28) + lVar8 * 8);
        if (*(long *)((long)pvVar6 + 0x28) == 0) {
          local_88.Start = (size_t *)0x0;
        }
        local_88.Count = (size_t *)(*(long *)((long)pvVar6 + 0x20) + lVar8 * 8);
        if (*(long *)((long)pvVar6 + 0x20) == 0) {
          local_88.Count = (size_t *)0x0;
        }
        local_88.BufferP = (void *)0x0;
        local_88.WriterID = (int)WriterRank;
        local_88.BlockID = BlockID;
        MinMaxStruct::Init(this_00,VarRec->Type);
        if (lVar9 != 0) {
          iVar1 = VarRec->ElementSize;
          ApplyElementMinMax(this_00,VarRec->Type,(void *)(BlockID * 2 * (long)iVar1 + lVar9));
          ApplyElementMinMax(this_00,VarRec->Type,(void *)((long)iVar1 * (BlockID * 2 + 1) + lVar9))
          ;
        }
        __position._M_current =
             (pMVar5->BlocksInfo).
             super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pMVar5->BlocksInfo).
            super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::MinBlockInfo,std::allocator<adios2::MinBlockInfo>>::
          _M_realloc_insert<adios2::MinBlockInfo_const&>
                    ((vector<adios2::MinBlockInfo,std::allocator<adios2::MinBlockInfo>> *)this_01,
                     __position,&local_88);
        }
        else {
          pMVar10 = &local_88;
          iVar11._M_current = __position._M_current;
          for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar3 = *(undefined4 *)&pMVar10->field_0x4;
            (iVar11._M_current)->WriterID = pMVar10->WriterID;
            *(undefined4 *)&(iVar11._M_current)->field_0x4 = uVar3;
            pMVar10 = (MinBlockInfo *)((long)pMVar10 + ((ulong)bVar13 * -2 + 1) * 8);
            iVar11._M_current = iVar11._M_current + (ulong)bVar13 * -0x10 + 8;
          }
          (pMVar5->BlocksInfo).
          super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      Step_00 = Step_00 + 1;
    } while (uVar12 != Step_00);
  }
  return pMVar5;
}

Assistant:

MinVarInfo *BP5Deserializer::MinBlocksInfo(const VariableBase &Var, size_t RelStep,
                                           size_t WriterRank, size_t BlockID)
{
    // this is only called for global and local arrays, so limited
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);

    MinVarInfo *MV = new MinVarInfo((int)VarRec->DimCount, VarRec->GlobalDims);

    size_t AbsStep = RelStep;
    size_t StepLoopStart, StepLoopEnd;

    if (m_RandomAccessMode)
    {
        AbsStep = VarRec->AbsStepFromRel[RelStep];
    }
    if (m_FlattenSteps)
    {
        StepLoopStart = 0;
        StepLoopEnd = m_ControlArray.size();
    }
    else
    {
        StepLoopStart = AbsStep;
        StepLoopEnd = AbsStep + 1;
    }
    size_t Id = 0;
    MV->Step = RelStep;
    MV->Dims = (int)VarRec->DimCount;
    MV->Shape = NULL;
    MV->IsReverseDims = ((MV->Dims > 1) && (m_WriterIsRowMajor != m_ReaderIsRowMajor));

    MV->WasLocalValue = (VarRec->OrigShapeID == ShapeID::LocalValue);
    if ((VarRec->OrigShapeID == ShapeID::LocalValue) ||
        (VarRec->OrigShapeID == ShapeID::GlobalValue))
    {
        // Throw
    }
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
        if (writer_meta_base)
        {
            if (MV->Shape == NULL)
            {
                MV->Shape = writer_meta_base->Shape;
            }
            Id += 1; // one block
        }
    }
    MV->BlocksInfo.reserve(Id);

    Id = BlockID;
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);

        if (!writer_meta_base)
            continue;
        size_t WriterBlockCount = MV->Dims ? writer_meta_base->DBCount / MV->Dims : 1;
        if (BlockID >= WriterBlockCount)
        {
            // throw
        }
        MinMaxStruct *MMs = NULL;
        if (VarRec->MinMaxOffset != SIZE_MAX)
        {
            MMs = *(MinMaxStruct **)(((char *)writer_meta_base) + VarRec->MinMaxOffset);
        }
        size_t *Offsets = NULL;
        size_t *Count = NULL;
        if (writer_meta_base->Offsets)
            Offsets = writer_meta_base->Offsets + (BlockID * MV->Dims);
        if (writer_meta_base->Count)
            Count = writer_meta_base->Count + (BlockID * MV->Dims);
        MinBlockInfo Blk;
        Blk.WriterID = (int)WriterRank;
        Blk.BlockID = Id;
        Blk.Start = Offsets;
        Blk.Count = Count;
        Blk.MinMax.Init(VarRec->Type);
        if (MMs)
        {
            char *BlockMinAddr = (((char *)MMs) + 2 * BlockID * VarRec->ElementSize);
            char *BlockMaxAddr = (((char *)MMs) + (2 * BlockID + 1) * VarRec->ElementSize);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMinAddr);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMaxAddr);
        }
        // Blk.BufferP
        MV->BlocksInfo.push_back(Blk);
    }
    return MV;
}